

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O1

StringRef llvm::dwarf::TagString(uint Tag)

{
  char *pcVar1;
  size_t sVar2;
  StringRef SVar3;
  
  sVar2 = 0;
  pcVar1 = (char *)0x0;
  if ((int)Tag < 0x4101) {
    switch(Tag) {
    case 0:
      sVar2 = 0xb;
      pcVar1 = "DW_TAG_null";
      break;
    case 1:
      sVar2 = 0x11;
      pcVar1 = "DW_TAG_array_type";
      break;
    case 2:
      sVar2 = 0x11;
      pcVar1 = "DW_TAG_class_type";
      break;
    case 3:
      sVar2 = 0x12;
      pcVar1 = "DW_TAG_entry_point";
      break;
    case 4:
      sVar2 = 0x17;
      pcVar1 = "DW_TAG_enumeration_type";
      break;
    case 5:
      sVar2 = 0x17;
      pcVar1 = "DW_TAG_formal_parameter";
      break;
    case 6:
    case 7:
    case 9:
    case 0xc:
    case 0xe:
    case 0x14:
    case 0x3e:
      break;
    case 8:
      sVar2 = 0x1b;
      pcVar1 = "DW_TAG_imported_declaration";
      break;
    case 10:
      sVar2 = 0xc;
      pcVar1 = "DW_TAG_label";
      break;
    case 0xb:
      sVar2 = 0x14;
      pcVar1 = "DW_TAG_lexical_block";
      break;
    case 0xd:
      sVar2 = 0xd;
      pcVar1 = "DW_TAG_member";
      break;
    case 0xf:
      sVar2 = 0x13;
      pcVar1 = "DW_TAG_pointer_type";
      break;
    case 0x10:
      sVar2 = 0x15;
      pcVar1 = "DW_TAG_reference_type";
      break;
    case 0x11:
      sVar2 = 0x13;
      pcVar1 = "DW_TAG_compile_unit";
      break;
    case 0x12:
      sVar2 = 0x12;
      pcVar1 = "DW_TAG_string_type";
      break;
    case 0x13:
      sVar2 = 0x15;
      pcVar1 = "DW_TAG_structure_type";
      break;
    case 0x15:
      sVar2 = 0x16;
      pcVar1 = "DW_TAG_subroutine_type";
      break;
    case 0x16:
      sVar2 = 0xe;
      pcVar1 = "DW_TAG_typedef";
      break;
    case 0x17:
      sVar2 = 0x11;
      pcVar1 = "DW_TAG_union_type";
      break;
    case 0x18:
      sVar2 = 0x1d;
      pcVar1 = "DW_TAG_unspecified_parameters";
      break;
    case 0x19:
      sVar2 = 0xe;
      pcVar1 = "DW_TAG_variant";
      break;
    case 0x1a:
      sVar2 = 0x13;
      pcVar1 = "DW_TAG_common_block";
      break;
    case 0x1b:
      sVar2 = 0x17;
      pcVar1 = "DW_TAG_common_inclusion";
      break;
    case 0x1c:
      sVar2 = 0x12;
      pcVar1 = "DW_TAG_inheritance";
      break;
    case 0x1d:
      sVar2 = 0x19;
      pcVar1 = "DW_TAG_inlined_subroutine";
      break;
    case 0x1e:
      sVar2 = 0xd;
      pcVar1 = "DW_TAG_module";
      break;
    case 0x1f:
      sVar2 = 0x19;
      pcVar1 = "DW_TAG_ptr_to_member_type";
      break;
    case 0x20:
      sVar2 = 0xf;
      pcVar1 = "DW_TAG_set_type";
      break;
    case 0x21:
      sVar2 = 0x14;
      pcVar1 = "DW_TAG_subrange_type";
      break;
    case 0x22:
      sVar2 = 0x10;
      pcVar1 = "DW_TAG_with_stmt";
      break;
    case 0x23:
      sVar2 = 0x19;
      pcVar1 = "DW_TAG_access_declaration";
      break;
    case 0x24:
      sVar2 = 0x10;
      pcVar1 = "DW_TAG_base_type";
      break;
    case 0x25:
      sVar2 = 0x12;
      pcVar1 = "DW_TAG_catch_block";
      break;
    case 0x26:
      sVar2 = 0x11;
      pcVar1 = "DW_TAG_const_type";
      break;
    case 0x27:
      sVar2 = 0xf;
      pcVar1 = "DW_TAG_constant";
      break;
    case 0x28:
      sVar2 = 0x11;
      pcVar1 = "DW_TAG_enumerator";
      break;
    case 0x29:
      sVar2 = 0x10;
      pcVar1 = "DW_TAG_file_type";
      break;
    case 0x2a:
      sVar2 = 0xd;
      pcVar1 = "DW_TAG_friend";
      break;
    case 0x2b:
      sVar2 = 0xf;
      pcVar1 = "DW_TAG_namelist";
      break;
    case 0x2c:
      sVar2 = 0x14;
      pcVar1 = "DW_TAG_namelist_item";
      break;
    case 0x2d:
      sVar2 = 0x12;
      pcVar1 = "DW_TAG_packed_type";
      break;
    case 0x2e:
      sVar2 = 0x11;
      pcVar1 = "DW_TAG_subprogram";
      break;
    case 0x2f:
      sVar2 = 0x1e;
      pcVar1 = "DW_TAG_template_type_parameter";
      break;
    case 0x30:
      sVar2 = 0x1f;
      pcVar1 = "DW_TAG_template_value_parameter";
      break;
    case 0x31:
      sVar2 = 0x12;
      pcVar1 = "DW_TAG_thrown_type";
      break;
    case 0x32:
      sVar2 = 0x10;
      pcVar1 = "DW_TAG_try_block";
      break;
    case 0x33:
      sVar2 = 0x13;
      pcVar1 = "DW_TAG_variant_part";
      break;
    case 0x34:
      sVar2 = 0xf;
      pcVar1 = "DW_TAG_variable";
      break;
    case 0x35:
      sVar2 = 0x14;
      pcVar1 = "DW_TAG_volatile_type";
      break;
    case 0x36:
      sVar2 = 0x16;
      pcVar1 = "DW_TAG_dwarf_procedure";
      break;
    case 0x37:
      sVar2 = 0x14;
      pcVar1 = "DW_TAG_restrict_type";
      break;
    case 0x38:
      sVar2 = 0x15;
      pcVar1 = "DW_TAG_interface_type";
      break;
    case 0x39:
      sVar2 = 0x10;
      pcVar1 = "DW_TAG_namespace";
      break;
    case 0x3a:
      sVar2 = 0x16;
      pcVar1 = "DW_TAG_imported_module";
      break;
    case 0x3b:
      sVar2 = 0x17;
      pcVar1 = "DW_TAG_unspecified_type";
      break;
    case 0x3c:
      sVar2 = 0x13;
      pcVar1 = "DW_TAG_partial_unit";
      break;
    case 0x3d:
      sVar2 = 0x14;
      pcVar1 = "DW_TAG_imported_unit";
      break;
    case 0x3f:
      sVar2 = 0x10;
      pcVar1 = "DW_TAG_condition";
      break;
    case 0x40:
      sVar2 = 0x12;
      pcVar1 = "DW_TAG_shared_type";
      break;
    case 0x41:
      sVar2 = 0x10;
      pcVar1 = "DW_TAG_type_unit";
      break;
    case 0x42:
      sVar2 = 0x1c;
      pcVar1 = "DW_TAG_rvalue_reference_type";
      break;
    case 0x43:
      sVar2 = 0x15;
      pcVar1 = "DW_TAG_template_alias";
      break;
    case 0x44:
      sVar2 = 0x13;
      pcVar1 = "DW_TAG_coarray_type";
      break;
    case 0x45:
      sVar2 = 0x17;
      pcVar1 = "DW_TAG_generic_subrange";
      break;
    case 0x46:
      sVar2 = 0x13;
      pcVar1 = "DW_TAG_dynamic_type";
      break;
    case 0x47:
      sVar2 = 0x12;
      pcVar1 = "DW_TAG_atomic_type";
      break;
    case 0x48:
      sVar2 = 0x10;
      pcVar1 = "DW_TAG_call_site";
      break;
    case 0x49:
      sVar2 = 0x1a;
      pcVar1 = "DW_TAG_call_site_parameter";
      break;
    case 0x4a:
      sVar2 = 0x14;
      pcVar1 = "DW_TAG_skeleton_unit";
      break;
    case 0x4b:
      sVar2 = 0x15;
      pcVar1 = "DW_TAG_immutable_type";
      break;
    default:
      if (Tag == 0x4081) {
        pcVar1 = "DW_TAG_MIPS_loop";
        sVar2 = 0x10;
      }
    }
  }
  else {
    switch(Tag) {
    case 0x4101:
      sVar2 = 0x13;
      pcVar1 = "DW_TAG_format_label";
      break;
    case 0x4102:
      sVar2 = 0x18;
      pcVar1 = "DW_TAG_function_template";
      break;
    case 0x4103:
      sVar2 = 0x15;
      pcVar1 = "DW_TAG_class_template";
      break;
    case 0x4104:
    case 0x4105:
      break;
    case 0x4106:
      sVar2 = 0x22;
      pcVar1 = "DW_TAG_GNU_template_template_param";
      break;
    case 0x4107:
      sVar2 = 0x22;
      pcVar1 = "DW_TAG_GNU_template_parameter_pack";
      break;
    case 0x4108:
      sVar2 = 0x20;
      pcVar1 = "DW_TAG_GNU_formal_parameter_pack";
      break;
    case 0x4109:
      sVar2 = 0x14;
      pcVar1 = "DW_TAG_GNU_call_site";
      break;
    case 0x410a:
      sVar2 = 0x1e;
      pcVar1 = "DW_TAG_GNU_call_site_parameter";
      break;
    default:
      switch(Tag) {
      case 0xb000:
        sVar2 = 0x17;
        pcVar1 = "DW_TAG_BORLAND_property";
        break;
      case 0xb001:
        sVar2 = 0x1c;
        pcVar1 = "DW_TAG_BORLAND_Delphi_string";
        break;
      case 0xb002:
        sVar2 = 0x23;
        pcVar1 = "DW_TAG_BORLAND_Delphi_dynamic_array";
        break;
      case 0xb003:
        sVar2 = 0x19;
        pcVar1 = "DW_TAG_BORLAND_Delphi_set";
        break;
      case 0xb004:
        sVar2 = 0x1d;
        pcVar1 = "DW_TAG_BORLAND_Delphi_variant";
        break;
      default:
        pcVar1 = (char *)0x0;
        sVar2 = 0;
        if (Tag == 0x4200) {
          sVar2 = 0x15;
          pcVar1 = "DW_TAG_APPLE_property";
        }
      }
    }
  }
  SVar3.Length = sVar2;
  SVar3.Data = pcVar1;
  return SVar3;
}

Assistant:

StringRef llvm::dwarf::TagString(unsigned Tag) {
  switch (Tag) {
  default:
    return StringRef();
#define HANDLE_DW_TAG(ID, NAME, VERSION, VENDOR, KIND)                         \
  case DW_TAG_##NAME:                                                          \
    return "DW_TAG_" #NAME;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}